

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriQuery.c
# Opt level: O0

wchar_t uriComposeQueryExA(char *dest,UriQueryListA *queryList,wchar_t maxChars,
                          wchar_t *charsWritten,UriBool spaceToPlus,UriBool normalizeBreaks)

{
  UriBool normalizeBreaks_local;
  UriBool spaceToPlus_local;
  wchar_t *charsWritten_local;
  wchar_t maxChars_local;
  UriQueryListA *queryList_local;
  char *dest_local;
  
  if ((dest == (char *)0x0) || (queryList == (UriQueryListA *)0x0)) {
    dest_local._4_4_ = L'\x02';
  }
  else if (maxChars < L'\x01') {
    dest_local._4_4_ = L'\x04';
  }
  else {
    dest_local._4_4_ =
         uriComposeQueryEngineA
                   (dest,queryList,maxChars,charsWritten,(wchar_t *)0x0,spaceToPlus,normalizeBreaks)
    ;
  }
  return dest_local._4_4_;
}

Assistant:

int URI_FUNC(ComposeQueryEx)(URI_CHAR * dest,
		const URI_TYPE(QueryList) * queryList, int maxChars, int * charsWritten,
		UriBool spaceToPlus, UriBool normalizeBreaks) {
	if ((dest == NULL) || (queryList == NULL)) {
		return URI_ERROR_NULL;
	}

	if (maxChars < 1) {
		return URI_ERROR_OUTPUT_TOO_LARGE;
	}

	return URI_FUNC(ComposeQueryEngine)(dest, queryList, maxChars,
			charsWritten, NULL, spaceToPlus, normalizeBreaks);
}